

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

void vrna_md_defaults_noGU(int flag)

{
  int flag_local;
  
  defaults.noGU = (int)(flag != 0);
  noGU = defaults.noGU;
  vrna_md_update(&defaults);
  return;
}

Assistant:

PUBLIC void
vrna_md_defaults_noGU(int flag)
{
  defaults.noGU = flag ? 1 : 0;
#ifndef VRNA_DISABLE_BACKWARD_COMPATIBILITY
  noGU = defaults.noGU;
#endif
  /* update pair/rtype/alias arrays accordingly */
  vrna_md_update(&defaults);
}